

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  float *pfVar2;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  int i_1;
  int j;
  int i;
  float *outptr;
  int q_1;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int ret;
  Option *in_stack_000002a8;
  float in_stack_000002b4;
  int in_stack_000002b8;
  float in_stack_000002bc;
  Mat *in_stack_000002c0;
  Mat *in_stack_000002c8;
  Option *in_stack_000002e8;
  float in_stack_000002f4;
  int in_stack_000002f8;
  float in_stack_000002fc;
  Mat *in_stack_00000300;
  Mat *in_stack_00000308;
  int in_stack_ffffffffffffff34;
  Mat *this_00;
  int local_a8;
  int local_a4;
  int local_a0;
  Mat local_90;
  float *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  long local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_4 = reduction_op<std::plus<float>,std::plus<float>>
                        (in_stack_00000308,in_stack_00000300,in_stack_000002fc,in_stack_000002f8,
                         in_stack_000002f4,in_stack_000002e8);
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_4 = reduction_op<ncnn::reduction_op_asum<float>,std::plus<float>>
                        (in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,
                         in_stack_000002b4,in_stack_000002a8);
  }
  else if (*(int *)(in_RDI + 0x80) == 2) {
    local_4 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,
                         in_stack_000002b4,in_stack_000002a8);
  }
  else {
    if (*(int *)(in_RDI + 0x80) == 3) {
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_2c = reduction_op<std::plus<float>,std::plus<float>>
                           (in_stack_00000308,in_stack_00000300,in_stack_000002fc,in_stack_000002f8,
                            in_stack_000002f4,in_stack_000002e8);
      if (local_2c != 0) {
        return -100;
      }
      local_30 = *(int *)(local_18 + 0x2c);
      local_34 = *(int *)(local_18 + 0x30);
      local_38 = *(int *)(local_18 + 0x34);
      local_3c = local_30 * local_34;
      if (*(int *)(in_RDI + 0x84) == 0) {
        iVar1 = local_38 * local_3c;
        pfVar2 = Mat::operator[](local_20,0);
        *pfVar2 = *pfVar2 / (float)iVar1;
      }
      else if (*(int *)(in_RDI + 0x84) == 1) {
        for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
          fVar3 = (float)local_3c;
          pfVar2 = Mat::operator[](local_20,local_40);
          *pfVar2 = *pfVar2 / fVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == 2) {
        for (local_44 = 0; local_44 < local_38; local_44 = local_44 + 1) {
          this_00 = &local_90;
          Mat::channel(this_00,in_stack_ffffffffffffff34);
          pfVar2 = Mat::operator_cast_to_float_(this_00);
          Mat::~Mat((Mat *)0x15d605);
          for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
            pfVar2[local_a0] = pfVar2[local_a0] / (float)local_30;
          }
          local_50 = pfVar2;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == -1) {
        for (local_a4 = 0; local_a4 < local_30; local_a4 = local_a4 + 1) {
          fVar3 = (float)(local_34 * local_38);
          pfVar2 = Mat::operator[](local_20,local_a4);
          *pfVar2 = *pfVar2 / fVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == -2) {
        for (local_a8 = 0; local_a8 < local_3c; local_a8 = local_a8 + 1) {
          fVar3 = (float)local_38;
          pfVar2 = Mat::operator[](local_20,local_a8);
          *pfVar2 = *pfVar2 / fVar3;
        }
      }
    }
    if (*(int *)(in_RDI + 0x80) == 4) {
      local_4 = reduction_op<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>>
                          (in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,
                           in_stack_000002b4,in_stack_000002a8);
    }
    else if (*(int *)(in_RDI + 0x80) == 5) {
      local_4 = reduction_op<ncnn::reduction_op_min<float>,ncnn::reduction_op_min<float>>
                          (in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,
                           in_stack_000002b4,in_stack_000002a8);
    }
    else if (*(int *)(in_RDI + 0x80) == 6) {
      local_4 = reduction_op<std::multiplies<float>,std::multiplies<float>>
                          (in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,
                           in_stack_000002b4,in_stack_000002a8);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff, opt);

    return 0;
}